

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Float32_To_Int8_DitherClip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    fVar2 = PaUtil_GenerateFloatTriangularDither(ditherGenerator);
    fVar2 = *sourceBuffer * 126.0 + fVar2;
    fVar3 = -128.0;
    if (-128.0 <= fVar2) {
      fVar3 = fVar2;
    }
    fVar2 = 127.0;
    if (fVar3 <= 127.0) {
      fVar2 = fVar3;
    }
    *(char *)destinationBuffer = (char)(int)fVar2;
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
  }
  return;
}

Assistant:

static void Float32_To_Int8_DitherClip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (126.0f)) + dither;
        PaInt32 samp = (PaInt32) dithered;
        PA_CLIP_( samp, -0x80, 0x7F );
        *dest = (signed char) samp;

        src += sourceStride;
        dest += destinationStride;
    }
}